

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O3

path * __thiscall
ghc::filesystem::path::lexically_relative(path *__return_storage_ptr__,path *this,path *base)

{
  char cVar1;
  int iVar2;
  int iVar3;
  size_type sVar4;
  path *element;
  format fVar5;
  undefined1 *puVar7;
  bool bVar8;
  path *result;
  iterator __begin2;
  iterator __end2;
  const_iterator a;
  const_iterator b;
  undefined1 *local_268;
  long local_260;
  undefined1 local_258 [16];
  undefined1 local_248 [40];
  path local_220;
  undefined1 local_1f8 [32];
  const_iterator local_1d8;
  _Alloc_hider local_1d0;
  size_type local_1c8;
  char local_1c0 [16];
  undefined4 local_1b0;
  undefined4 uStack_1ac;
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  undefined4 local_1a0;
  undefined4 uStack_19c;
  undefined4 uStack_198;
  undefined4 uStack_194;
  const_iterator local_190;
  _Alloc_hider local_188;
  size_type local_180;
  char local_178 [16];
  undefined1 *local_168 [2];
  undefined1 local_158 [16];
  path local_148;
  const_iterator local_128;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined4 local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  char *local_108;
  undefined1 *local_100 [2];
  undefined1 local_f0 [16];
  path local_e0;
  iterator local_c0;
  iterator local_78;
  pointer pcVar6;
  
  root_name((path *)local_1f8,this);
  root_name((path *)&local_c0,base);
  iVar2 = compare((path *)local_1f8,(path *)&local_c0);
  if (iVar2 == 0) {
    sVar4 = root_name_length(this);
    if (sVar4 < (this->_path)._M_string_length) {
      cVar1 = (this->_path)._M_dataplus._M_p[sVar4];
      sVar4 = root_name_length(base);
      if (sVar4 < (base->_path)._M_string_length) {
        if (((base->_path)._M_dataplus._M_p[sVar4] == '/') != (cVar1 == '/')) goto LAB_0015ec52;
      }
      else if (cVar1 == '/') goto LAB_0015ec52;
LAB_0015ed0d:
      sVar4 = root_name_length(this);
      if ((sVar4 < (this->_path)._M_string_length) && ((this->_path)._M_dataplus._M_p[sVar4] == '/')
         ) {
        if ((const_iterator *)local_c0._first._M_current != &local_c0._prefix) {
          operator_delete(local_c0._first._M_current);
        }
        if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
          operator_delete((void *)local_1f8._0_8_);
        }
LAB_0015eda2:
        local_1f8._0_8_ = (this->_path)._M_dataplus._M_p;
        iterator::iterator(&local_c0,this,(const_iterator *)local_1f8);
        local_1f8._0_8_ = (base->_path)._M_dataplus._M_p;
        iterator::iterator(&local_78,base,(const_iterator *)local_1f8);
        while( true ) {
          local_248._0_8_ = (this->_path)._M_dataplus._M_p + (this->_path)._M_string_length;
          iterator::iterator((iterator *)local_1f8,this,(const_iterator *)local_248);
          if (local_c0._iter._M_current == local_1d8._M_current) {
            bVar8 = false;
          }
          else {
            local_128._M_current = (base->_path)._M_dataplus._M_p + (base->_path)._M_string_length;
            iterator::iterator((iterator *)local_248,base,&local_128);
            if (local_78._iter._M_current == (char *)local_248._32_8_) {
              bVar8 = false;
            }
            else {
              iVar2 = compare(&local_c0._current,&local_78._current);
              bVar8 = iVar2 == 0;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_220._path._M_dataplus._M_p != &local_220._path.field_2) {
              operator_delete(local_220._path._M_dataplus._M_p);
            }
          }
          if (local_1d0._M_p != local_1c0) {
            operator_delete(local_1d0._M_p);
          }
          if (!bVar8) break;
          iterator::operator++(&local_c0);
          iterator::operator++(&local_78);
        }
        local_248._0_8_ = (this->_path)._M_dataplus._M_p + (this->_path)._M_string_length;
        iterator::iterator((iterator *)local_1f8,this,(const_iterator *)local_248);
        if (local_c0._iter._M_current == local_1d8._M_current) {
          local_128._M_current = (base->_path)._M_dataplus._M_p + (base->_path)._M_string_length;
          iterator::iterator((iterator *)local_248,base,&local_128);
          bVar8 = local_78._iter._M_current == (char *)local_248._32_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_220._path._M_dataplus._M_p != &local_220._path.field_2) {
            operator_delete(local_220._path._M_dataplus._M_p);
          }
        }
        else {
          bVar8 = false;
        }
        if (local_1d0._M_p != local_1c0) {
          operator_delete(local_1d0._M_p);
        }
        if (bVar8) {
          local_1f8._0_8_ = local_1f8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,".","");
          (__return_storage_ptr__->_path)._M_dataplus._M_p =
               (pointer)&(__return_storage_ptr__->_path).field_2;
          pcVar6 = (pointer)local_1f8._0_8_;
          std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    ((string *)__return_storage_ptr__,local_1f8._0_8_,
                     (pointer)(local_1f8._0_8_ + CONCAT44(local_1f8._12_4_,local_1f8._8_4_)));
          fVar5 = (format)pcVar6;
          if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
            operator_delete((void *)local_1f8._0_8_);
          }
          postprocess_path_with_format(__return_storage_ptr__,fVar5);
        }
        else {
          local_128._M_current = (base->_path)._M_dataplus._M_p + (base->_path)._M_string_length;
          iterator::iterator((iterator *)local_248,base,&local_128);
          input_iterator_range<ghc::filesystem::path::iterator>::input_iterator_range
                    ((input_iterator_range<ghc::filesystem::path::iterator> *)local_1f8,&local_78,
                     (iterator *)local_248);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_220._path._M_dataplus._M_p != &local_220._path.field_2) {
            operator_delete(local_220._path._M_dataplus._M_p);
          }
          local_248._32_8_ = local_1d8._M_current;
          local_248._16_4_ = local_1f8._16_4_;
          local_248._20_4_ = local_1f8._20_4_;
          local_248._24_4_ = local_1f8._24_4_;
          local_248._28_4_ = local_1f8._28_4_;
          local_248._0_8_ = local_1f8._0_8_;
          local_248._8_4_ = local_1f8._8_4_;
          local_248._12_4_ = local_1f8._12_4_;
          local_220._path._M_dataplus._M_p = (pointer)&local_220._path.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_220,local_1d0._M_p,local_1d0._M_p + local_1c8);
          local_108 = local_190._M_current;
          local_118 = local_1a0;
          uStack_114 = uStack_19c;
          uStack_110 = uStack_198;
          uStack_10c = uStack_194;
          local_128._M_current._4_4_ = uStack_1ac;
          local_128._M_current._0_4_ = local_1b0;
          uStack_120 = uStack_1a8;
          uStack_11c = uStack_1a4;
          local_100[0] = local_f0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_100,local_188._M_p,local_188._M_p + local_180);
          iVar2 = 0;
          while ((char *)local_248._32_8_ != local_108) {
            local_268 = local_258;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,".","");
            local_168[0] = local_158;
            puVar7 = local_268;
            std::__cxx11::string::
            _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      ((string *)local_168,local_268,local_268 + local_260);
            fVar5 = (format)puVar7;
            if (local_268 != local_258) {
              operator_delete(local_268);
            }
            postprocess_path_with_format((path *)local_168,fVar5);
            iVar3 = compare(&local_220,(path *)local_168);
            if (iVar3 == 0) {
              bVar8 = false;
            }
            else {
              local_268 = local_258;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"");
              local_148._path._M_dataplus._M_p = (pointer)&local_148._path.field_2;
              puVar7 = local_268;
              std::__cxx11::string::
              _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                        ((string *)&local_148,local_268,local_268 + local_260);
              fVar5 = (format)puVar7;
              if (local_268 != local_258) {
                operator_delete(local_268);
              }
              postprocess_path_with_format(&local_148,fVar5);
              iVar3 = compare(&local_220,&local_148);
              if (iVar3 == 0) {
                bVar8 = false;
              }
              else {
                local_268 = local_258;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"..","");
                local_e0._path._M_dataplus._M_p = (pointer)&local_e0._path.field_2;
                puVar7 = local_268;
                std::__cxx11::string::
                _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                          ((string *)&local_e0,local_268,local_268 + local_260);
                fVar5 = (format)puVar7;
                if (local_268 != local_258) {
                  operator_delete(local_268);
                }
                postprocess_path_with_format(&local_e0,fVar5);
                iVar3 = compare(&local_220,&local_e0);
                bVar8 = iVar3 != 0;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_e0._path._M_dataplus._M_p != &local_e0._path.field_2) {
                  operator_delete(local_e0._path._M_dataplus._M_p);
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_148._path._M_dataplus._M_p != &local_148._path.field_2) {
                operator_delete(local_148._path._M_dataplus._M_p);
              }
            }
            if (local_168[0] != local_158) {
              operator_delete(local_168[0]);
            }
            iVar3 = 1;
            if (!bVar8) {
              local_268 = local_258;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"..","");
              local_168[0] = local_158;
              puVar7 = local_268;
              std::__cxx11::string::
              _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                        ((string *)local_168,local_268,local_268 + local_260);
              fVar5 = (format)puVar7;
              if (local_268 != local_258) {
                operator_delete(local_268);
              }
              postprocess_path_with_format((path *)local_168,fVar5);
              iVar3 = compare(&local_220,(path *)local_168);
              if (local_168[0] != local_158) {
                operator_delete(local_168[0]);
              }
              iVar3 = -(uint)(iVar3 == 0);
            }
            iVar2 = iVar2 + iVar3;
            iterator::operator++((iterator *)local_248);
          }
          if (local_100[0] != local_f0) {
            operator_delete(local_100[0]);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_220._path._M_dataplus._M_p != &local_220._path.field_2) {
            operator_delete(local_220._path._M_dataplus._M_p);
          }
          if (local_188._M_p != local_178) {
            operator_delete(local_188._M_p);
          }
          if (local_1d0._M_p != local_1c0) {
            operator_delete(local_1d0._M_p);
          }
          (__return_storage_ptr__->_path)._M_dataplus._M_p =
               (pointer)&(__return_storage_ptr__->_path).field_2;
          (__return_storage_ptr__->_path)._M_string_length = 0;
          (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
          if (-1 < iVar2) {
            for (; iVar2 != 0; iVar2 = iVar2 + -1) {
              append<char[3]>(__return_storage_ptr__,(char (*) [3])0x2116be);
            }
            local_128._M_current = (this->_path)._M_dataplus._M_p + (this->_path)._M_string_length;
            iterator::iterator((iterator *)local_248,this,&local_128);
            input_iterator_range<ghc::filesystem::path::iterator>::input_iterator_range
                      ((input_iterator_range<ghc::filesystem::path::iterator> *)local_1f8,&local_c0,
                       (iterator *)local_248);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_220._path._M_dataplus._M_p != &local_220._path.field_2) {
              operator_delete(local_220._path._M_dataplus._M_p);
            }
            local_248._32_8_ = local_1d8._M_current;
            local_248._16_4_ = local_1f8._16_4_;
            local_248._20_4_ = local_1f8._20_4_;
            local_248._24_4_ = local_1f8._24_4_;
            local_248._28_4_ = local_1f8._28_4_;
            local_248._0_8_ = local_1f8._0_8_;
            local_248._8_4_ = local_1f8._8_4_;
            local_248._12_4_ = local_1f8._12_4_;
            local_220._path._M_dataplus._M_p = (pointer)&local_220._path.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_220,local_1d0._M_p,local_1d0._M_p + local_1c8);
            local_108 = local_190._M_current;
            local_118 = local_1a0;
            uStack_114 = uStack_19c;
            uStack_110 = uStack_198;
            uStack_10c = uStack_194;
            local_128._M_current._4_4_ = uStack_1ac;
            local_128._M_current._0_4_ = local_1b0;
            uStack_120 = uStack_1a8;
            uStack_11c = uStack_1a4;
            local_100[0] = local_f0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_100,local_188._M_p,local_188._M_p + local_180);
            while ((char *)local_248._32_8_ != local_108) {
              operator/=(__return_storage_ptr__,&local_220);
              iterator::operator++((iterator *)local_248);
            }
            if (local_100[0] != local_f0) {
              operator_delete(local_100[0]);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_220._path._M_dataplus._M_p != &local_220._path.field_2) {
              operator_delete(local_220._path._M_dataplus._M_p);
            }
            if (local_188._M_p != local_178) {
              operator_delete(local_188._M_p);
            }
            if (local_1d0._M_p != local_1c0) {
              operator_delete(local_1d0._M_p);
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._current._path._M_dataplus._M_p != &local_78._current._path.field_2) {
          operator_delete(local_78._current._path._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._current._path._M_dataplus._M_p == &local_c0._current._path.field_2) {
          return __return_storage_ptr__;
        }
        operator_delete(local_c0._current._path._M_dataplus._M_p);
        return __return_storage_ptr__;
      }
      sVar4 = root_name_length(base);
      if (sVar4 < (base->_path)._M_string_length) {
        bVar8 = (base->_path)._M_dataplus._M_p[sVar4] == '/';
      }
      else {
        bVar8 = false;
      }
      if ((const_iterator *)local_c0._first._M_current != &local_c0._prefix) {
        operator_delete(local_c0._first._M_current);
      }
      if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
        operator_delete((void *)local_1f8._0_8_);
      }
      if (!bVar8) goto LAB_0015eda2;
      goto LAB_0015ec7e;
    }
    sVar4 = root_name_length(base);
    if (((base->_path)._M_string_length <= sVar4) || ((base->_path)._M_dataplus._M_p[sVar4] != '/'))
    goto LAB_0015ed0d;
  }
LAB_0015ec52:
  if ((const_iterator *)local_c0._first._M_current != &local_c0._prefix) {
    operator_delete(local_c0._first._M_current);
  }
  if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
    operator_delete((void *)local_1f8._0_8_);
  }
LAB_0015ec7e:
  (__return_storage_ptr__->_path)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->_path).field_2;
  (__return_storage_ptr__->_path)._M_string_length = 0;
  (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path path::lexically_relative(const path& base) const
{
    if (root_name() != base.root_name() || is_absolute() != base.is_absolute() || (!has_root_directory() && base.has_root_directory())) {
        return path();
    }
    const_iterator a = begin(), b = base.begin();
    while (a != end() && b != base.end() && *a == *b) {
        ++a;
        ++b;
    }
    if (a == end() && b == base.end()) {
        return path(".");
    }
    int count = 0;
    for (const auto& element : input_iterator_range<const_iterator>(b, base.end())) {
        if (element != "." && element != "" && element != "..") {
            ++count;
        }
        else if (element == "..") {
            --count;
        }
    }
    if (count < 0) {
        return path();
    }
    path result;
    for (int i = 0; i < count; ++i) {
        result /= "..";
    }
    for (const auto& element : input_iterator_range<const_iterator>(a, end())) {
        result /= element;
    }
    return result;
}